

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderWarmupTimer(CHud *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int64 iVar8;
  IClient *this_00;
  ITextRender *pIVar9;
  long in_RDI;
  long in_FS_OFFSET;
  float f;
  float Seconds;
  int64 CursorVersion;
  bool LargeTimer;
  char *pText;
  char aBuf [256];
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  CTextCursor *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  CTextCursor *in_stack_fffffffffffffea0;
  CHud *pCVar10;
  CHud *in_stack_fffffffffffffeb0;
  CHud local_108;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((RenderWarmupTimer()::s_Cursor == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RenderWarmupTimer()::s_Cursor), iVar3 != 0)) {
    CTextCursor::CTextCursor(in_stack_fffffffffffffea0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderWarmupTimer::s_Cursor,&__dso_handle);
    __cxa_guard_release(&RenderWarmupTimer()::s_Cursor);
  }
  RenderWarmupTimer::s_Cursor.m_MaxLines = 2;
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 1) == 0) {
    if (((*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8) == 0) &&
        (0 < *(int *)(*(long *)(in_RDI + 8) + 0xe1c))) ||
       (*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8) != 0)) {
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
  }
  else {
    pcVar6 = Localize((char *)in_stack_fffffffffffffea0,
                      (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar2 = IsLargeWarmupTimerShown((CHud *)in_stack_fffffffffffffea0);
    if (*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8) == 0) {
      CLocalizationDatabase::Version(&g_Localization);
      if (*(int *)(*(long *)(in_RDI + 8) + 0xe1c) == 1) {
        pCVar10 = &local_108;
        pcVar7 = Localize((char *)in_stack_fffffffffffffea0,
                          (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        str_format((char *)pCVar10,0x100,pcVar7,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xe1c));
        RenderReadyUpNotification(pCVar10);
      }
      else if (*(int *)(*(long *)(in_RDI + 8) + 0xe1c) < 2) {
        pCVar10 = &local_108;
        pcVar7 = Localize((char *)pCVar10,
                          (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        str_format((char *)pCVar10,0x100,pcVar7);
        if (*(long *)(in_RDI + 0x20) == 0) {
          iVar8 = time_get();
          *(int64 *)(in_RDI + 0x20) = iVar8;
        }
      }
      else {
        pcVar7 = Localize((char *)in_stack_fffffffffffffea0,
                          (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        str_format((char *)&local_108,0x100,pcVar7,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xe1c));
        RenderReadyUpNotification(in_stack_fffffffffffffeb0);
      }
      CTextCursor::Reset(in_stack_fffffffffffffe90,
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    else {
      iVar3 = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8);
      this_00 = CComponent::Client((CComponent *)0x166be9);
      iVar4 = IClient::GameTick(this_00);
      f = (float)(iVar3 - iVar4) / 50.0;
      if (5.0 <= f) {
        in_stack_fffffffffffffe90 = (CTextCursor *)&local_108;
        uVar5 = round_to_int(f);
        str_format((char *)in_stack_fffffffffffffe90,0x100,"%d",(ulong)uVar5);
      }
      else {
        str_format((char *)(double)f,(int)&local_108,(char *)0x100,"%.1f");
      }
      CTextCursor::Reset(in_stack_fffffffffffffe90,
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    if (bVar2) {
      CComponent::Graphics((CComponent *)0x166c99);
      IGraphics::ScreenAspect((IGraphics *)in_stack_fffffffffffffe90);
      CTextCursor::MoveTo(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88);
      RenderWarmupTimer::s_Cursor.m_Align = 1;
      RenderWarmupTimer::s_Cursor.m_LineSpacing = 5.0;
      RenderWarmupTimer::s_Cursor.m_FontSize = 20.0;
      pIVar9 = CComponent::TextRender((CComponent *)0x166cf8);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&RenderWarmupTimer::s_Cursor,pcVar6,0xffffffff);
      RenderWarmupTimer::s_Cursor.m_FontSize = 16.0;
      pIVar9 = CComponent::TextRender((CComponent *)0x166d2c);
      (*(pIVar9->super_IInterface)._vptr_IInterface[8])(pIVar9,&RenderWarmupTimer::s_Cursor);
      pIVar9 = CComponent::TextRender((CComponent *)0x166d46);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&RenderWarmupTimer::s_Cursor,&local_108,0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x166d6a);
      (*(pIVar9->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,pIVar9,&RenderWarmupTimer::s_Cursor,0,0xffffffff);
    }
    else {
      CTextCursor::MoveTo(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88);
      RenderWarmupTimer::s_Cursor.m_Align = 0;
      RenderWarmupTimer::s_Cursor.m_LineSpacing = 1.0;
      pIVar9 = CComponent::TextRender((CComponent *)0x166dd1);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f000000);
      RenderWarmupTimer::s_Cursor.m_FontSize = 8.0;
      pIVar9 = CComponent::TextRender((CComponent *)0x166e0a);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&RenderWarmupTimer::s_Cursor,pcVar6,0xffffffff);
      RenderWarmupTimer::s_Cursor.m_FontSize = 6.0;
      pIVar9 = CComponent::TextRender((CComponent *)0x166e3e);
      (*(pIVar9->super_IInterface)._vptr_IInterface[8])(pIVar9,&RenderWarmupTimer::s_Cursor);
      pIVar9 = CComponent::TextRender((CComponent *)0x166e58);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&RenderWarmupTimer::s_Cursor,&local_108,0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x166e7c);
      (*(pIVar9->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,pIVar9,&RenderWarmupTimer::s_Cursor,0,0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x166ea8);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderWarmupTimer()
{
	static CTextCursor s_Cursor;
	s_Cursor.m_MaxLines = 2;

	// render warmup timer
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP)
	{
		char aBuf[256];
		const char *pText = Localize("Warmup");
		const bool LargeTimer = IsLargeWarmupTimerShown();

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
		{
			const int64 CursorVersion = g_Localization.Version() << 9 | m_pClient->m_Snap.m_NotReadyCount << 1 | (LargeTimer ? 1 : 0);
			if(m_pClient->m_Snap.m_NotReadyCount == 1)
			{
				str_format(aBuf, sizeof(aBuf), Localize("%d player not ready"), m_pClient->m_Snap.m_NotReadyCount);
				RenderReadyUpNotification();
			}
			else if(m_pClient->m_Snap.m_NotReadyCount > 1)
			{
				str_format(aBuf, sizeof(aBuf), Localize("%d players not ready"), m_pClient->m_Snap.m_NotReadyCount);
				RenderReadyUpNotification();
			}
			else
			{
				str_format(aBuf, sizeof(aBuf), Localize("wait for more players"));
				if(m_WarmupHideTick == 0)
					m_WarmupHideTick = time_get();
			}
			s_Cursor.Reset(CursorVersion);
		}
		else
		{
			float Seconds = static_cast<float>(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick())/SERVER_TICK_SPEED;
			if(Seconds < 5)
				str_format(aBuf, sizeof(aBuf), "%.1f", Seconds);
			else
				str_format(aBuf, sizeof(aBuf), "%d", round_to_int(Seconds));
			s_Cursor.Reset();
		}

		if(LargeTimer)
		{
			s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
			s_Cursor.m_Align = TEXTALIGN_TC;
			s_Cursor.m_LineSpacing = 5.0f;

			s_Cursor.m_FontSize = 20.0f;
			TextRender()->TextDeferred(&s_Cursor, pText, -1);
			s_Cursor.m_FontSize = 16.0f;
			TextRender()->TextNewline(&s_Cursor);
			TextRender()->TextDeferred(&s_Cursor, aBuf, -1);
			TextRender()->DrawTextOutlined(&s_Cursor);
		}
		else
		{
			s_Cursor.MoveTo(10, 45);
			s_Cursor.m_Align = TEXTALIGN_TL;
			s_Cursor.m_LineSpacing = 1.0f;
			
			TextRender()->TextColor(1, 1, 0.5f, 1);
			s_Cursor.m_FontSize = 8.0f;
			TextRender()->TextDeferred(&s_Cursor, pText, -1);
			s_Cursor.m_FontSize = 6.0f;
			TextRender()->TextNewline(&s_Cursor);
			TextRender()->TextDeferred(&s_Cursor, aBuf, -1);
			TextRender()->DrawTextOutlined(&s_Cursor);
			TextRender()->TextColor(1, 1, 1, 1);
		}
	}
	else if((m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0 && m_pClient->m_Snap.m_NotReadyCount > 0) || m_pClient->m_Snap.m_pGameData->m_GameStateEndTick != 0)
		m_WarmupHideTick = 0;
}